

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmAbc.c
# Opt level: O2

Mig_Man_t * Mig_ManCreate(void *pGia)

{
  Mig_Fan_t MVar1;
  char *__s;
  long lVar2;
  ulong uVar3;
  uint l;
  uint l_00;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Mig_Man_t *pMig;
  size_t sVar9;
  char *__dest;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pGVar10;
  Mig_Obj_t *pMVar11;
  long lVar12;
  Vec_Int_t *p;
  Mig_Fan_t *pMVar13;
  
  __dest = (char *)0x0;
  pMig = Mig_ManStart();
  __s = *pGia;
  if (__s != (char *)0x0) {
    sVar9 = strlen(__s);
    __dest = (char *)malloc(sVar9 + 1);
    strcpy(__dest,__s);
  }
  pMig->pName = __dest;
  *(undefined4 *)(*(long *)((long)pGia + 0x20) + 8) = 0;
  for (lVar12 = 1; lVar12 < *(int *)((long)pGia + 0x18); lVar12 = lVar12 + 1) {
    pObj = Gia_ManObj((Gia_Man_t *)pGia,(int)lVar12);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if ((*(long *)((long)pGia + 0x28) == 0) ||
       (*(int *)(*(long *)((long)pGia + 0x28) + lVar12 * 4) == 0)) {
      uVar3 = *(ulong *)pObj;
      uVar4 = (uint)uVar3;
      if (((uVar3 & 0x1fffffff) == 0x1fffffff || (int)uVar4 < 0) ||
         (((uint)(uVar3 >> 0x20) & 0x1fffffff) <= (uVar4 & 0x1fffffff))) {
        iVar6 = (int)(uVar3 & 0x1fffffff);
        if (iVar6 == 0x1fffffff || (int)uVar4 < 0) {
          if ((~uVar4 & 0x9fffffff) == 0) {
            pMVar11 = Mig_ManAppendObj(pMig);
            Mig_ObjSetCioId(pMVar11,(pMig->vCis).nSize);
            MVar1 = pMVar11->pFans[3];
            p = &pMig->vCis;
          }
          else {
            if ((-1 < (int)uVar4) || (iVar6 == 0x1fffffff)) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmAbc.c"
                            ,0x68,"Mig_Man_t *Mig_ManCreate(void *)");
            }
            iVar6 = Mig_ObjFanin0Copy(pObj);
            iVar7 = Abc_Lit2Var(iVar6);
            pMVar11 = Mig_ManObj(pMig,iVar7);
            iVar7 = Mig_ObjIsCo(pMVar11);
            if (iVar7 != 0) {
              __assert_fail("!Mig_ObjIsCo(Mig_ManObj(p, Abc_Lit2Var(iLit0)))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                            ,0xf8,"int Mig_ManAppendCo(Mig_Man_t *, int)");
            }
            pMVar11 = Mig_ManAppendObj(pMig);
            Mig_ObjSetFaninLit(pMVar11,0,iVar6);
            Mig_ObjSetCioId(pMVar11,(pMig->vCos).nSize);
            MVar1 = pMVar11->pFans[3];
            p = &pMig->vCos;
          }
          pMVar13 = pMVar11->pFans + 3;
          Vec_IntPush(p,(uint)MVar1 >> 1);
          goto LAB_00701175;
        }
        uVar5 = Mig_ObjFanin0Copy(pObj);
        uVar4 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
        uVar4 = Abc_LitNotCond(pObj[-(ulong)(uVar4 & 0x1fffffff)].Value,uVar4 >> 0x1d & 1);
        pMVar11 = Mig_ManAppendObj(pMig);
        if (uVar5 == uVar4) {
          __assert_fail("iLit0 != iLit1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                        ,0x109,"int Mig_ManAppendAnd(Mig_Man_t *, int, int)");
        }
        uVar8 = uVar4;
        if (uVar5 < uVar4) {
          uVar8 = uVar5;
        }
        if (uVar4 < uVar5) {
          uVar4 = uVar5;
        }
        Mig_ObjSetFaninLit(pMVar11,0,uVar8);
      }
      else {
        uVar5 = Gia_ObjFanin0Copy(pObj);
        uVar4 = Gia_ObjFanin1Copy(pObj);
        pMVar11 = Mig_ManAppendObj(pMig);
        if (uVar5 == uVar4) {
          __assert_fail("iLit0 != iLit1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                        ,0x111,"int Mig_ManAppendXor(Mig_Man_t *, int, int)");
        }
        iVar6 = Abc_LitIsCompl(uVar5);
        if (iVar6 != 0) {
LAB_007011d6:
          __assert_fail("!Abc_LitIsCompl(iLit0) && !Abc_LitIsCompl(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                        ,0x112,"int Mig_ManAppendXor(Mig_Man_t *, int, int)");
        }
        iVar6 = Abc_LitIsCompl(uVar4);
        if (iVar6 != 0) goto LAB_007011d6;
        uVar8 = uVar4;
        if (uVar5 >= uVar4 && uVar5 != uVar4) {
          uVar8 = uVar5;
        }
        if (uVar5 < uVar4) {
          uVar4 = uVar5;
        }
        Mig_ObjSetFaninLit(pMVar11,0,uVar8);
      }
      Mig_ObjSetFaninLit(pMVar11,1,uVar4);
      pMVar13 = pMVar11->pFans + 3;
    }
    else {
      uVar4 = Gia_ObjFanin0Copy(pObj);
      uVar5 = Gia_ObjFanin1Copy(pObj);
      lVar2 = *(long *)((long)pGia + 0x28);
      if (lVar2 == 0) {
        iVar6 = 0;
        uVar8 = _DAT_00000008;
      }
      else {
        iVar6 = Gia_ObjId((Gia_Man_t *)pGia,pObj);
        iVar6 = Abc_Lit2Var(*(int *)(lVar2 + (long)iVar6 * 4));
        pGVar10 = Gia_ManObj((Gia_Man_t *)pGia,iVar6);
        lVar2 = *(long *)((long)pGia + 0x28);
        uVar8 = pGVar10->Value;
        if (lVar2 == 0) {
          iVar6 = 0;
        }
        else {
          iVar6 = Gia_ObjId((Gia_Man_t *)pGia,pObj);
          iVar6 = Abc_LitIsCompl(*(int *)(lVar2 + (long)iVar6 * 4));
        }
      }
      uVar8 = Abc_LitNotCond(uVar8,iVar6);
      pMVar11 = Mig_ManAppendObj(pMig);
      if (((uVar5 == uVar8) || (uVar4 == uVar5)) || (uVar4 == uVar8)) {
        __assert_fail("iLit0 != iLit1 && iLit0 != iCtrl && iLit1 != iCtrl",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                      ,0x11a,"int Mig_ManAppendMux(Mig_Man_t *, int, int, int)");
      }
      iVar6 = Abc_LitIsCompl(uVar4);
      if (iVar6 != 0) {
        iVar6 = Abc_LitIsCompl(uVar5);
        if (iVar6 != 0) {
          __assert_fail("!Abc_LitIsCompl(iLit0) || !Abc_LitIsCompl(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                        ,0x11b,"int Mig_ManAppendMux(Mig_Man_t *, int, int, int)");
        }
      }
      l = uVar5;
      if (uVar4 < uVar5) {
        l = uVar4;
      }
      l_00 = uVar5;
      if (uVar5 < uVar4) {
        l_00 = uVar4;
      }
      Mig_ObjSetFaninLit(pMVar11,0,l);
      Mig_ObjSetFaninLit(pMVar11,1,l_00);
      if (uVar5 <= uVar4) {
        uVar8 = Abc_LitNot(uVar8);
      }
      Mig_ObjSetFaninLit(pMVar11,2,uVar8);
      pMVar13 = pMVar11->pFans + 3;
    }
LAB_00701175:
    pObj->Value = (uint)*pMVar13 & 0xfffffffe;
  }
  pMig->nRegs = *(int *)((long)pGia + 0x10);
  if (*(long *)((long)pGia + 0xd0) != 0) {
    Mig_ManCreateChoices(pMig,(Gia_Man_t *)pGia);
  }
  return pMig;
}

Assistant:

Mig_Man_t * Mig_ManCreate( void * pGia )
{
    Gia_Man_t * p = (Gia_Man_t *)pGia;
    Mig_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Mig_ManStart();
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsMuxId(p, i) )
            pObj->Value = Mig_ManAppendMux( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin2Copy(p, pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Mig_ManAppendXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Mig_ManAppendAnd( pNew, Mig_ObjFanin0Copy(pObj), Mig_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Mig_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Mig_ManAppendCo( pNew, Mig_ObjFanin0Copy(pObj) );
        else assert( 0 );
    }
    Mig_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    if ( Gia_ManHasChoices(p) )
        Mig_ManCreateChoices( pNew, p );
    return pNew;
}